

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O3

char * Kit_DsdWriteHex(char *pBuff,uint *pTruth,int nFans)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = 1 << ((byte)nFans & 0x1f);
  if (3 < (int)uVar3) {
    uVar4 = (uVar3 >> 2) + 1;
    uVar3 = uVar3 & 0xfffffffc;
    do {
      uVar3 = uVar3 - 4;
      uVar5 = pTruth[uVar4 - 2 >> 3] >> ((byte)uVar3 & 0x1c) & 0xf;
      cVar1 = (char)uVar5;
      cVar2 = cVar1 + '7';
      if (uVar5 < 10) {
        cVar2 = cVar1 + '0';
      }
      *pBuff = cVar2;
      pBuff = pBuff + 1;
      uVar4 = uVar4 - 1;
    } while (1 < uVar4);
  }
  return pBuff;
}

Assistant:

char * Kit_DsdWriteHex( char * pBuff, unsigned * pTruth, int nFans )
{
    int nDigits, Digit, k;
    nDigits = (1 << nFans) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            *pBuff++ = '0' + Digit;
        else
            *pBuff++ = 'A' + Digit-10;
    }
    return pBuff;
}